

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O2

void set_fnumber(EOPLL *opll,int ch,int fnum)

{
  uint32_t *puVar1;
  int iVar2;
  int iVar3;
  ushort uVar4;
  
  iVar3 = ch * 2 + 1;
  iVar2 = ch * 2;
  uVar4 = (ushort)fnum;
  opll->slot[iVar3].fnum = uVar4;
  opll->slot[iVar3].blk_fnum = opll->slot[iVar3].blk_fnum & 0xe00 | uVar4 & 0x1ff;
  opll->slot[iVar2].fnum = uVar4;
  opll->slot[iVar2].blk_fnum = opll->slot[iVar2].blk_fnum & 0xe00 | uVar4 & 0x1ff;
  puVar1 = &opll->slot[iVar3].update_requests;
  *(byte *)puVar1 = (byte)*puVar1 | 0xe;
  puVar1 = &opll->slot[iVar2].update_requests;
  *(byte *)puVar1 = (byte)*puVar1 | 0xe;
  return;
}

Assistant:

static INLINE void set_fnumber(EOPLL *opll, int ch, int fnum) {
  EOPLL_SLOT *car = CAR(opll, ch);
  EOPLL_SLOT *mod = MOD(opll, ch);
  car->fnum = fnum;
  car->blk_fnum = (car->blk_fnum & 0xe00) | (fnum & 0x1ff);
  mod->fnum = fnum;
  mod->blk_fnum = (mod->blk_fnum & 0xe00) | (fnum & 0x1ff);
  request_update(car, UPDATE_EG | UPDATE_RKS | UPDATE_TLL);
  request_update(mod, UPDATE_EG | UPDATE_RKS | UPDATE_TLL);
}